

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawIndexedTest.cpp
# Opt level: O0

void __thiscall
vkt::Draw::anon_unknown_10::DrawIndexed::DrawIndexed
          (DrawIndexed *this,Context *context,TestSpec *testSpec)

{
  VkPrimitiveTopology VVar1;
  char *vertexShaderName;
  deUint32 dVar2;
  mapped_type *ppcVar3;
  Vec4 local_348;
  Vector<float,_4> local_338;
  VertexElementData local_328;
  deUint32 local_304;
  Vec4 local_300;
  Vector<float,_4> local_2f0;
  VertexElementData local_2e0;
  deUint32 local_2bc;
  Vec4 local_2b8;
  Vector<float,_4> local_2a8;
  VertexElementData local_298;
  deUint32 local_274;
  Vec4 local_270;
  Vector<float,_4> local_260;
  VertexElementData local_250;
  deUint32 local_22c;
  Vec4 local_228;
  Vector<float,_4> local_218;
  VertexElementData local_208;
  deUint32 local_1e4;
  Vec4 local_1e0;
  Vector<float,_4> local_1d0;
  VertexElementData local_1c0;
  deUint32 local_19c;
  Vec4 local_198;
  Vector<float,_4> local_188;
  VertexElementData local_178;
  deUint32 local_154;
  Vec4 local_150;
  Vector<float,_4> local_140;
  VertexElementData local_130;
  deUint32 local_10c;
  Vec4 local_108;
  Vector<float,_4> local_f8;
  VertexElementData local_e8;
  deUint32 local_c4;
  deUint32 local_c0;
  int vertexIndex;
  Vector<float,_4> local_ac;
  VertexElementData local_9c;
  int local_78;
  value_type_conflict2 local_74;
  int unusedIdx;
  value_type_conflict2 local_6c [17];
  key_type local_28 [2];
  TestSpec *local_20;
  TestSpec *testSpec_local;
  Context *context_local;
  DrawIndexed *this_local;
  
  local_28[1] = 0;
  local_20 = testSpec;
  testSpec_local = (TestSpec *)context;
  context_local = (Context *)this;
  ppcVar3 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[](&testSpec->shaders,local_28 + 1);
  vertexShaderName = *ppcVar3;
  local_28[0] = SHADERTYPE_FRAGMENT;
  ppcVar3 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[](&testSpec->shaders,local_28);
  DrawTestsBaseClass::DrawTestsBaseClass
            (&this->super_DrawTestsBaseClass,context,vertexShaderName,*ppcVar3,testSpec->topology);
  (this->super_DrawTestsBaseClass).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__DrawIndexed_016ad940;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_indexes);
  de::SharedPtr<vkt::Draw::Buffer>::SharedPtr(&this->m_indexBuffer);
  VVar1 = (this->super_DrawTestsBaseClass).m_topology;
  if (VK_PRIMITIVE_TOPOLOGY_LINE_STRIP < VVar1) {
    if (VVar1 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
      local_6c[0xd] = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_indexes,local_6c + 0xd);
      local_6c[0xc] = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_indexes,local_6c + 0xc);
      local_6c[0xb] = 2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_indexes,local_6c + 0xb);
      local_6c[10] = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_indexes,local_6c + 10);
      local_6c[9] = 6;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_indexes,local_6c + 9);
      local_6c[8] = 6;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_indexes,local_6c + 8);
      local_6c[7] = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_indexes,local_6c + 7);
      local_6c[6] = 7;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_indexes,local_6c + 6);
    }
    else if (VVar1 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
      local_6c[5] = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_indexes,local_6c + 5);
      local_6c[4] = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_indexes,local_6c + 4);
      local_6c[3] = 2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_indexes,local_6c + 3);
      local_6c[2] = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_indexes,local_6c + 2);
      local_6c[1] = 6;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_indexes,local_6c + 1);
      local_6c[0] = 5;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->m_indexes,local_6c)
      ;
      unusedIdx = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_indexes,(value_type_conflict2 *)&unusedIdx);
      local_74 = 7;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_indexes,&local_74);
    }
  }
  for (local_78 = 0; local_78 < 0xd; local_78 = local_78 + 1) {
    tcu::Vector<float,_4>::Vector(&local_ac,-1.0,1.0,1.0,1.0);
    local_c0 = (deUint32)tcu::RGBA::blue();
    tcu::RGBA::toVec((RGBA *)&vertexIndex);
    VertexElementData::VertexElementData(&local_9c,&local_ac,(Vec4 *)&vertexIndex,0xffffffff);
    std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
    push_back(&(this->super_DrawTestsBaseClass).m_data,&local_9c);
  }
  local_c4 = 0xd;
  tcu::Vector<float,_4>::Vector(&local_f8,-0.3,0.3,1.0,1.0);
  local_10c = (deUint32)tcu::RGBA::blue();
  tcu::RGBA::toVec((RGBA *)&local_108);
  dVar2 = local_c4;
  local_c4 = local_c4 + 1;
  VertexElementData::VertexElementData(&local_e8,&local_f8,&local_108,dVar2);
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  push_back(&(this->super_DrawTestsBaseClass).m_data,&local_e8);
  tcu::Vector<float,_4>::Vector(&local_140,-1.0,1.0,1.0,1.0);
  local_154 = (deUint32)tcu::RGBA::blue();
  tcu::RGBA::toVec((RGBA *)&local_150);
  dVar2 = local_c4;
  local_c4 = local_c4 + 1;
  VertexElementData::VertexElementData(&local_130,&local_140,&local_150,dVar2);
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  push_back(&(this->super_DrawTestsBaseClass).m_data,&local_130);
  tcu::Vector<float,_4>::Vector(&local_188,-0.3,-0.3,1.0,1.0);
  local_19c = (deUint32)tcu::RGBA::blue();
  tcu::RGBA::toVec((RGBA *)&local_198);
  dVar2 = local_c4;
  local_c4 = local_c4 + 1;
  VertexElementData::VertexElementData(&local_178,&local_188,&local_198,dVar2);
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  push_back(&(this->super_DrawTestsBaseClass).m_data,&local_178);
  tcu::Vector<float,_4>::Vector(&local_1d0,1.0,-1.0,1.0,1.0);
  local_1e4 = (deUint32)tcu::RGBA::blue();
  tcu::RGBA::toVec((RGBA *)&local_1e0);
  dVar2 = local_c4;
  local_c4 = local_c4 + 1;
  VertexElementData::VertexElementData(&local_1c0,&local_1d0,&local_1e0,dVar2);
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  push_back(&(this->super_DrawTestsBaseClass).m_data,&local_1c0);
  tcu::Vector<float,_4>::Vector(&local_218,-0.3,-0.3,1.0,1.0);
  local_22c = (deUint32)tcu::RGBA::blue();
  tcu::RGBA::toVec((RGBA *)&local_228);
  dVar2 = local_c4;
  local_c4 = local_c4 + 1;
  VertexElementData::VertexElementData(&local_208,&local_218,&local_228,dVar2);
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  push_back(&(this->super_DrawTestsBaseClass).m_data,&local_208);
  tcu::Vector<float,_4>::Vector(&local_260,0.3,0.3,1.0,1.0);
  local_274 = (deUint32)tcu::RGBA::blue();
  tcu::RGBA::toVec((RGBA *)&local_270);
  dVar2 = local_c4;
  local_c4 = local_c4 + 1;
  VertexElementData::VertexElementData(&local_250,&local_260,&local_270,dVar2);
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  push_back(&(this->super_DrawTestsBaseClass).m_data,&local_250);
  tcu::Vector<float,_4>::Vector(&local_2a8,0.3,-0.3,1.0,1.0);
  local_2bc = (deUint32)tcu::RGBA::blue();
  tcu::RGBA::toVec((RGBA *)&local_2b8);
  dVar2 = local_c4;
  local_c4 = local_c4 + 1;
  VertexElementData::VertexElementData(&local_298,&local_2a8,&local_2b8,dVar2);
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  push_back(&(this->super_DrawTestsBaseClass).m_data,&local_298);
  tcu::Vector<float,_4>::Vector(&local_2f0,0.3,0.3,1.0,1.0);
  local_304 = (deUint32)tcu::RGBA::blue();
  tcu::RGBA::toVec((RGBA *)&local_300);
  dVar2 = local_c4;
  local_c4 = local_c4 + 1;
  VertexElementData::VertexElementData(&local_2e0,&local_2f0,&local_300,dVar2);
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  push_back(&(this->super_DrawTestsBaseClass).m_data,&local_2e0);
  tcu::Vector<float,_4>::Vector(&local_338,-1.0,1.0,1.0,1.0);
  tcu::RGBA::blue();
  tcu::RGBA::toVec((RGBA *)&local_348);
  VertexElementData::VertexElementData(&local_328,&local_338,&local_348,0xffffffff);
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  push_back(&(this->super_DrawTestsBaseClass).m_data,&local_328);
  DrawTestsBaseClass::initialize(&this->super_DrawTestsBaseClass);
  return;
}

Assistant:

DrawIndexed::DrawIndexed (Context &context, TestSpec testSpec)
	: DrawTestsBaseClass(context, testSpec.shaders[glu::SHADERTYPE_VERTEX], testSpec.shaders[glu::SHADERTYPE_FRAGMENT], testSpec.topology)
{
	switch (m_topology)
	{
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
			m_indexes.push_back(0);
			m_indexes.push_back(0);
			m_indexes.push_back(2);
			m_indexes.push_back(0);
			m_indexes.push_back(6);
			m_indexes.push_back(6);
			m_indexes.push_back(0);
			m_indexes.push_back(7);
			break;
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
			m_indexes.push_back(0);
			m_indexes.push_back(0);
			m_indexes.push_back(2);
			m_indexes.push_back(0);
			m_indexes.push_back(6);
			m_indexes.push_back(5);
			m_indexes.push_back(0);
			m_indexes.push_back(7);
			break;

		case vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_PATCH_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LAST:
			DE_FATAL("Topology not implemented");
			break;
		default:
			DE_FATAL("Unknown topology");
			break;
	}

	for (int unusedIdx = 0; unusedIdx < VERTEX_OFFSET; unusedIdx++)
	{
		m_data.push_back(VertexElementData(tcu::Vec4(-1.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec(), -1));
	}

	int vertexIndex = VERTEX_OFFSET;

	m_data.push_back(VertexElementData(tcu::Vec4(	-0.3f,	 0.3f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	-1.0f,	 1.0f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	-0.3f,	-0.3f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	 1.0f,	-1.0f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	-0.3f,	-0.3f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	 0.3f,	 0.3f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	 0.3f,	-0.3f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	 0.3f,	 0.3f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));

	m_data.push_back(VertexElementData(tcu::Vec4(	-1.0f,	 1.0f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), -1));

	initialize();
}